

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicOrCase::verify
          (ShaderAtomicOrCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  Precision PVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int in_stack_00000008;
  long in_stack_00000010;
  Hex<8UL> local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [384];
  
  uVar9 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  local_1b8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar9;
  uVar6 = local_1b8 & 0xffffffff;
  PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar7 = 0xff;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar7 = 0xffff;
  }
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_UINT) {
    uVar7 = 0xffffffff;
  }
  if (PVar2 == PRECISION_HIGHP) {
    uVar7 = 0xffffffff;
  }
  if (0 < (int)local_1b8) {
    uVar3 = (this->super_ShaderAtomicOpCase).m_initialValue;
    local_1b8 = local_1b8 & 0xffffffff;
    iVar11 = 0;
    iVar8 = 0;
    uVar14 = 0;
    uVar6 = 0;
    do {
      iVar13 = (int)uVar14;
      uVar4 = *(uint *)(in_stack_00000010 + iVar13 * in_stack_00000008);
      uVar15 = (ulong)uVar9;
      iVar5 = iVar8;
      uVar10 = uVar3;
      if ((int)uVar9 < 1) {
        uVar15 = (ulong)(uVar3 ^ uVar4);
        if (((uVar3 ^ uVar4) & uVar7) != 0) goto LAB_004334a6;
      }
      else {
        do {
          uVar10 = uVar10 | *(uint *)(siglen + (long)iVar5);
          iVar5 = iVar5 + (int)sig;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        uVar15 = (ulong)(uVar10 ^ uVar4);
        if (((uVar10 ^ uVar4) & uVar7) != 0) {
LAB_004334a6:
          local_1b0._0_8_ =
               ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: at group ",0x10);
          std::ostream::operator<<(poVar1,iVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected ",0xb);
          local_1c0.value = (deUint64)uVar10;
          tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
          local_1c0.value = (ulong)uVar4;
          tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00433478:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          return (int)uVar6;
        }
        if (0 < (int)uVar9) {
          uVar12 = 0;
          iVar5 = iVar11;
          do {
            uVar4 = *(uint *)(tbslen + (long)iVar5);
            uVar10 = uVar4 & uVar7;
            uVar15 = (ulong)uVar10;
            if ((uVar10 & uVar3) == 0) {
              local_1b0._0_8_ =
                   ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"ERROR: at group ",0x10);
              std::ostream::operator<<(poVar1,iVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", invocation ",0xd);
              std::ostream::operator<<(poVar1,(int)uVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,": found unexpected value ",0x19);
              local_1c0.value = (ulong)uVar4;
              tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00433478;
            }
            uVar12 = uVar12 + 1;
            iVar5 = iVar5 + (int)tbs;
          } while (uVar9 != uVar12);
        }
      }
      uVar14 = uVar14 + 1;
      uVar6 = CONCAT71((int7)(uVar15 >> 8),local_1b8 <= uVar14);
      iVar8 = iVar8 + uVar9 * (int)sig;
      iVar11 = iVar11 + uVar9 * (int)tbs;
    } while (uVar14 != local_1b8);
  }
  return (int)CONCAT71((int7)(uVar6 >> 8),1);
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= (m_type == TYPE_UINT || numBits == 32) ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			deUint32		expectedValue	= m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				expectedValue |= inputValue;
			}

			if ((groupOutput & compareMask) != (expectedValue & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expectedValue) << ", got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((compareMask & (outputValue & m_initialValue)) == 0)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}